

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.c++
# Opt level: O0

void __thiscall kj::AtomicRefcounted::disposeImpl(AtomicRefcounted *this,void *pointer)

{
  uint *puVar1;
  uint uVar2;
  void *pointer_local;
  AtomicRefcounted *this_local;
  
  LOCK();
  puVar1 = &this->refcount;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if ((uVar2 == 1) && (this != (AtomicRefcounted *)0x0)) {
    (*(this->super_Disposer)._vptr_Disposer[2])();
  }
  return;
}

Assistant:

void AtomicRefcounted::disposeImpl(void* pointer) const {
#if _MSC_VER
  if (KJ_MSVC_INTERLOCKED(Decrement, rel)(&refcount) == 0) {
    std::atomic_thread_fence(std::memory_order_acquire);
    delete this;
  }
#else
  if (__atomic_sub_fetch(&refcount, 1, __ATOMIC_RELEASE) == 0) {
    __atomic_thread_fence(__ATOMIC_ACQUIRE);
    delete this;
  }
#endif
}